

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O1

int cstep(double *stx,double *fx,double *dx,double *sty,double *fy,double *dy,double *stp,double *fp
         ,double *dp,int *brackt,double stpmin,double stpmax)

{
  bool bVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double b;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  if (*brackt == 1) {
    dVar8 = *stp;
    dVar7 = pmin(*stx,*sty);
    if (dVar8 <= dVar7) {
      return 0;
    }
    dVar8 = *stp;
    dVar7 = pmax(*stx,*sty);
    if (dVar7 <= dVar8) {
      return 0;
    }
  }
  if (stpmax < stpmin) {
    return 0;
  }
  dVar8 = *dx;
  dVar7 = *stp;
  dVar9 = dVar7 - *stx;
  if (0.0 <= dVar8 * dVar9) {
    return 0;
  }
  dVar13 = *dp;
  b = ABS(dVar8);
  dVar12 = (dVar8 / b) * dVar13;
  dVar10 = *fp;
  dVar11 = *fx;
  if (dVar11 < dVar10) {
    dVar13 = dVar13 + dVar8 + ((dVar11 - dVar10) * 3.0) / dVar9;
    dVar8 = pmax(ABS(dVar13),b);
    dVar8 = pmax(dVar8,ABS(*dp));
    dVar7 = (dVar13 / dVar8) * (dVar13 / dVar8) - (*dx / dVar8) * (*dp / dVar8);
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    dVar9 = *stx;
    uVar6 = -(ulong)(*stp < dVar9);
    dVar10 = (double)(~uVar6 & (ulong)(dVar8 * dVar7) | (ulong)-(dVar8 * dVar7) & uVar6);
    dVar8 = *dx;
    dVar11 = dVar10 - dVar8;
    dVar7 = *stp - dVar9;
    dVar13 = ((dVar13 + dVar11) / (dVar11 + dVar10 + *dp)) * dVar7 + dVar9;
    dVar8 = (dVar8 / ((*fx - *fp) / dVar7 + dVar8)) * 0.5 * dVar7 + dVar9;
    uVar6 = -(ulong)(ABS(dVar13 - dVar9) < ABS(dVar8 - dVar9));
    dVar8 = (double)(~uVar6 & (ulong)((dVar8 - dVar13) * 0.5 + dVar13) | (ulong)dVar13 & uVar6);
    *brackt = 1;
    iVar5 = 1;
    bVar1 = true;
    goto LAB_00142442;
  }
  if (dVar12 < 0.0) {
    dVar13 = dVar13 + dVar8 + ((dVar11 - dVar10) * 3.0) / dVar9;
    dVar8 = pmax(ABS(dVar13),b);
    dVar8 = pmax(dVar8,ABS(*dp));
    dVar7 = (dVar13 / dVar8) * (dVar13 / dVar8) - (*dx / dVar8) * (*dp / dVar8);
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    dVar9 = *stp;
    uVar6 = -(ulong)(*stx < dVar9);
    dVar10 = (double)(~uVar6 & (ulong)(dVar8 * dVar7) | (ulong)-(dVar8 * dVar7) & uVar6);
    dVar8 = *dp;
    dVar11 = dVar10 - dVar8;
    dVar7 = *stx - dVar9;
    dVar13 = ((dVar13 + dVar11) / (dVar11 + dVar10 + *dx)) * dVar7 + dVar9;
    dVar8 = (dVar8 / (dVar8 - *dx)) * dVar7 + dVar9;
    uVar6 = -(ulong)(ABS(dVar8 - dVar9) < ABS(dVar13 - dVar9));
    dVar8 = (double)(~uVar6 & (ulong)dVar8 | (ulong)dVar13 & uVar6);
    *brackt = 1;
    iVar5 = 2;
    bVar1 = false;
    goto LAB_00142442;
  }
  if (b <= ABS(dVar13)) {
    if (*brackt == 1) {
      dVar13 = dVar13 + ((dVar10 - *fy) * 3.0) / (*sty - dVar7) + *dy;
      dVar8 = pmax(ABS(dVar13),ABS(*dy));
      dVar7 = pmax(dVar8,ABS(*dp));
      dVar9 = (dVar13 / dVar7) * (dVar13 / dVar7) - (*dy / dVar7) * (*dp / dVar7);
      if (dVar9 < 0.0) {
        dVar9 = sqrt(dVar9);
      }
      else {
        dVar9 = SQRT(dVar9);
      }
      dVar8 = *stp;
      uVar6 = -(ulong)(*sty < dVar8);
      dVar7 = (double)(~uVar6 & (ulong)(dVar7 * dVar9) | (ulong)-(dVar7 * dVar9) & uVar6);
      dVar9 = dVar7 - *dp;
      dVar8 = (*sty - dVar8) * ((dVar13 + dVar9) / (dVar9 + dVar7 + *dy)) + dVar8;
      iVar5 = 4;
      bVar1 = false;
    }
    else {
      uVar6 = -(ulong)(*stx < dVar7);
      dVar8 = (double)(~uVar6 & (ulong)stpmin | uVar6 & (ulong)stpmax);
      iVar5 = 4;
      bVar1 = false;
    }
    goto LAB_00142442;
  }
  dVar13 = dVar13 + dVar8 + ((dVar11 - dVar10) * 3.0) / dVar9;
  dVar8 = pmax(ABS(dVar13),b);
  dVar8 = pmax(dVar8,ABS(*dp));
  dVar7 = pmax(0.0,(dVar13 / dVar8) * (dVar13 / dVar8) - (*dx / dVar8) * (*dp / dVar8));
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  dVar8 = dVar8 * dVar7;
  dVar7 = *stp;
  dVar9 = *stx;
  dVar11 = -dVar8;
  uVar6 = -(ulong)(dVar9 < dVar7);
  dVar10 = *dp;
  if ((dVar8 != dVar11) || (NAN(dVar8) || NAN(dVar11))) {
    dVar8 = (double)(~uVar6 & (ulong)dVar8 | (ulong)dVar11 & uVar6);
    dVar8 = (dVar13 + (dVar8 - dVar10)) / ((*dx - dVar10) + dVar8 + dVar8);
    if (0.0 <= dVar8) goto LAB_001426ba;
    dVar8 = dVar8 * (dVar9 - dVar7) + dVar7;
  }
  else {
LAB_001426ba:
    dVar8 = (double)(~uVar6 & (ulong)stpmin | uVar6 & (ulong)stpmax);
  }
  dVar9 = (dVar9 - dVar7) * (dVar10 / (dVar10 - *dx)) + dVar7;
  if (*brackt == 1) {
    uVar6 = -(ulong)(ABS(dVar7 - dVar8) < ABS(dVar7 - dVar9));
    dVar8 = (double)(~uVar6 & (ulong)dVar9 | (ulong)dVar8 & uVar6);
    iVar5 = 3;
    bVar1 = true;
  }
  else {
    uVar6 = -(ulong)(ABS(dVar7 - dVar9) < ABS(dVar7 - dVar8));
    dVar8 = (double)(~uVar6 & (ulong)dVar9 | (ulong)dVar8 & uVar6);
    iVar5 = 3;
    bVar1 = true;
  }
LAB_00142442:
  pdVar2 = sty;
  pdVar3 = dy;
  pdVar4 = fy;
  if ((*fp < *fx || *fp == *fx) && (pdVar2 = stx, pdVar3 = dx, pdVar4 = fx, dVar12 < 0.0)) {
    *sty = *stx;
    *fy = *fx;
    *dy = *dx;
  }
  *pdVar2 = *stp;
  *pdVar4 = *fp;
  *pdVar3 = *dp;
  dVar8 = pmin(stpmax,dVar8);
  dVar8 = pmax(stpmin,dVar8);
  *stp = dVar8;
  if (bVar1 && *brackt == 1) {
    dVar7 = *stx;
    dVar9 = (*sty - dVar7) * 0.66 + dVar7;
    if (*sty <= dVar7) {
      dVar8 = pmax(dVar9,dVar8);
    }
    else {
      dVar8 = pmin(dVar9,dVar8);
    }
    *stp = dVar8;
  }
  return iVar5;
}

Assistant:

int cstep(double *stx,double *fx,double *dx,double *sty,double *fy,double *dy,double *stp,double *fp,double *dp,int *brackt,
                       double  stpmin,double stpmax) {
	int info,bound;
	double gamma, p, p66, q, r, s, sgnd, stpc, stpf, stpq, theta;

	info = 0;
	p66 = 0.66;

	if ((*brackt == 1 && (*stp <= pmin(*stx, *sty) || *stp >= pmax(*stx, *sty))) || *dx*(*stp - *stx) >= 0.0 || stpmax < stpmin) {
		return info;
	}

	sgnd = (*dp) * (*dx / fabs(*dx));

	/*
	 First case. A higher function value. (fp > fx)
     The minimum is bracketed. If the cubic step is closer
	 to stx than the quadratic step, the cubic step is taken,
     else the average of the cubic and quadratic steps is taken.
	*/

	if (*fp > *fx) {
		info = 1;
		bound = 1;
		theta = 3 * (*fx - *fp) / (*stp - *stx) + *dx + *dp;
		s = pmax(fabs(theta), fabs(*dx));
		s = pmax(s, fabs(*dp));
		gamma = s*sqrt((theta / s)*(theta/s) - (*dx / s)*(*dp / s));
		if (*stp < *stx) {
			gamma = -gamma;
		}
		p = (gamma - *dx) + theta;
		q = ((gamma - *dx) + gamma) + *dp;
		r = p / q;
		stpc = *stx + r*(*stp - *stx);
		stpq = *stx + ((*dx / ((*fx - *fp) / (*stp - *stx) + *dx)) / 2)*(*stp - *stx);

		if (fabs(stpc - *stx) < fabs(stpq - *stx)) {
			stpf = stpc;
		} else {
			stpf = stpc + (stpq - stpc) / 2;
		}
		*brackt = 1;
	} else if (sgnd < 0.0) {
		/*
		Second case. A lower function value and derivatives of
	    opposite sign. The minimum is bracketed. If the cubic
	    step is closer to stx than the quadratic (secant) step, 
	    the cubic step is taken, else the quadratic step is taken.
		*/

		info = 2;
		bound = 0;
		theta = 3 * (*fx - *fp) / (*stp - *stx) + *dx + *dp;
		s = pmax(fabs(theta), fabs(*dx));
		s = pmax(s, fabs(*dp));
		gamma = s*sqrt((theta / s)*(theta / s) - (*dx / s)*(*dp / s));
		if (*stp > *stx) {
			gamma = -gamma;
		}
		p = (gamma - *dp) + theta;
		q = ((gamma - *dp) + gamma) + *dx;
		r = p / q;
		stpc = *stp + r*(*stx - *stp);
		stpq = *stp + (*dp / (*dp - *dx))*(*stx - *stp);
		if (fabs(stpc - *stp) > fabs(stpq - *stp)) {
			stpf = stpc;
		} else {
			stpf = stpq;
		}
		*brackt = 1;
	}
	else if (fabs(*dp) < fabs(*dx)) {
		/*
     Third case. A lower function value, derivatives of the
     same sign, and the magnitude of the derivative decreases.
     The cubic step is only used if the cubic tends to infinity 
     in the direction of the step or if the minimum of the cubic
     is beyond stp. Otherwise the cubic step is defined to be 
     either stpmin or stpmax. The quadratic (secant) step is also 
     computed and if the minimum is bracketed then the the step 
     closest to stx is taken, else the step farthest away is taken.
		*/

		info = 3;
		bound = 1;
		theta = 3 * (*fx - *fp) / (*stp - *stx) + *dx + *dp;
		s = pmax(fabs(theta), fabs(*dx));
		s = pmax(s, fabs(*dp));

		/*
		 The case gamma = 0 only arises if the cubic does not tend
         to infinity in the direction of the step.
		*/

		gamma = s*sqrt(pmax(0., (theta / s)*(theta / s) - (*dx / s)*(*dp / s)));
		if (*stp > *stx) {
			gamma = -gamma;
		}
		p = (gamma - *dp) + theta;
		q = (gamma + (*dx - *dp)) + gamma;
		r = p / q;

		if (r < 0.0 && gamma != 0.0) {
			stpc = *stp + r*(*stx - *stp);
		} else if (*stp > *stx) {
			stpc = stpmax;
		} else {
			stpc = stpmin;
		}
		stpq = *stp + (*dp / (*dp - *dx))*(*stx - *stp);
		if (*brackt == 1) {
			if (fabs(*stp - stpc) < fabs(*stp - stpq)) {
				stpf = stpc;
			} else {
				stpf = stpq;
			}
		} else {
			if (fabs(*stp - stpc) > fabs(*stp - stpq)) {
				stpf = stpc;
			} else {
				stpf = stpq;
			}
		}
	}
	else {
		/*
     Fourth case. A lower function value, derivatives of the
     same sign, and the magnitude of the derivative does
     not decrease. If the minimum is not bracketed, the step
     is either stpmin or stpmax, else the cubic step is taken.

		*/
		info = 4;
		bound = 0;
		if (*brackt == 1) {
			theta = 3 * (*fp - *fy) / (*sty - *stp) + *dy + *dp;
			s = pmax(fabs(theta), fabs(*dy));
			s = pmax(s,fabs(*dp));
			gamma = s*sqrt((theta / s)*(theta / s) - (*dy / s)*(*dp / s));
			if (*stp > *sty) {
				gamma = -gamma;
			}
			p = (gamma - *dp) + theta;
			q = ((gamma - *dp) + gamma) + *dy;
			r = p / q;
			stpc = *stp + r*(*sty - *stp);
			stpf = stpc;
		}
		else if (*stp > *stx) {
			stpf = stpmax;
		}
		else {
			stpf = stpmin;
		}
		
	}
	/*
	Update the interval of uncertainty. This update does not
    depend on the new step or the case analysis above.
	*/

	if (*fp > *fx) {
		*sty = *stp;
		*fy = *fp;
		*dy = *dp;
	} else { 
		if (sgnd < 0.0) {
			*sty = *stx;
			*fy = *fx;
			*dy = *dx;
		}
		*stx = *stp;
		*fx = *fp;
		*dx = *dp;
	}
	/*
	Compute the new step and safeguard it.
	*/

	stpf = pmin(stpmax, stpf);
	stpf = pmax(stpmin, stpf);
	*stp = stpf;
	if (*brackt == 1 && bound == 1) {
		if (*sty > *stx) {
			*stp = pmin(*stx + p66*(*sty - *stx), *stp);
		} else {
			*stp = pmax(*stx + p66*(*sty - *stx), *stp);
		}
	}


	return info;
}